

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::~FusionEKF(FusionEKF *this)

{
  FusionEKF *this_local;
  
  ~FusionEKF(this);
  operator_delete(this);
  return;
}

Assistant:

FusionEKF::~FusionEKF() {}